

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O1

bool __thiscall
ON_Arc::GetNurbFormParameterFromRadian(ON_Arc *this,double RadianParameter,double *NurbParameter)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  ON_3dPoint *pOVar6;
  ON_Plane *pOVar7;
  ON_3dVector *pOVar8;
  int i;
  long lVar9;
  int i_00;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar13;
  double dVar14;
  ON_Interval OVar15;
  ON_Interval ADomain;
  ON_3dPoint cp;
  ON_NurbsCurve crv;
  ON_BezierCurve bez;
  ON_Interval BezDomain;
  double a [3];
  ON_Xform COC;
  double local_208;
  ON_Interval local_1e8;
  undefined1 local_1d8 [16];
  ON_3dPoint local_1c0;
  ON_NurbsCurve local_1a8;
  ON_BezierCurve local_168;
  ON_Interval local_148;
  ON_Plane local_138;
  ON_Xform local_b0;
  
  bVar2 = IsValid(this);
  if (NurbParameter == (double *)0x0 || !bVar2) {
    bVar2 = false;
  }
  else {
    OVar15 = DomainRadians(this);
    local_1e8.m_t[1] = OVar15.m_t[1];
    local_1e8.m_t[0] = OVar15.m_t[0];
    pdVar5 = ON_Interval::operator[](&local_1e8,0);
    dVar13 = *pdVar5;
    pdVar5 = ON_Interval::operator[](&local_1e8,1);
    dVar13 = (ABS(*pdVar5) + ABS(dVar13)) * 2.220446049250313e-15;
    pdVar5 = ON_Interval::operator[](&local_1e8,0);
    if ((dVar13 < RadianParameter - *pdVar5) || (RadianParameter - *pdVar5 < -1.490116119385e-08)) {
      pdVar5 = ON_Interval::operator[](&local_1e8,1);
      if ((dVar13 < *pdVar5 - RadianParameter) || (*pdVar5 - RadianParameter < -1.490116119385e-08))
      {
        bVar2 = ON_Interval::Includes(&local_1e8,RadianParameter,false);
        if (!bVar2) {
          return false;
        }
        ON_NurbsCurve::ON_NurbsCurve(&local_1a8);
        bVar2 = NurbsCurveArc(this,3,&local_1a8);
        if (bVar2) {
          iVar3 = ON_NurbsCurve::SpanCount(&local_1a8);
          pdVar5 = ON_Interval::operator[](&local_1e8,0);
          local_208 = *pdVar5;
          dVar13 = ON_NurbsCurve::Knot(&local_1a8,0);
          ON_Curve::PointAt(&local_138.origin,&local_1a8.super_ON_Curve,dVar13);
          pOVar6 = ON_Circle::Center(&this->super_ON_Circle);
          ON_3dPoint::operator-((ON_3dVector *)&local_b0,&local_138.origin,pOVar6);
          ON_3dPoint::operator=(&local_1c0,(ON_3dVector *)&local_b0);
          pOVar7 = ON_Circle::Plane(&this->super_ON_Circle);
          pOVar8 = ON_Plane::Xaxis(pOVar7);
          ON_3dVector::ON_3dVector((ON_3dVector *)&local_b0,&local_1c0);
          dVar13 = ON_DotProduct(pOVar8,(ON_3dVector *)&local_b0);
          pOVar7 = ON_Circle::Plane(&this->super_ON_Circle);
          pOVar8 = ON_Plane::Yaxis(pOVar7);
          ON_3dVector::ON_3dVector((ON_3dVector *)&local_b0,&local_1c0);
          dVar14 = ON_DotProduct(pOVar8,(ON_3dVector *)&local_b0);
          dVar13 = atan2(dVar14,dVar13);
          if (iVar3 < 1) {
            i_00 = 0;
          }
          else {
            i_00 = 0;
            uVar11 = SUB84(dVar13,0);
            uVar12 = (int)((ulong)dVar13 >> 0x20);
            do {
              dVar13 = ON_NurbsCurve::Knot(&local_1a8,i_00 + 2);
              ON_Curve::PointAt(&local_138.origin,&local_1a8.super_ON_Curve,dVar13);
              pOVar6 = ON_Circle::Center(&this->super_ON_Circle);
              ON_3dPoint::operator-((ON_3dVector *)&local_b0,&local_138.origin,pOVar6);
              ON_3dPoint::operator=(&local_1c0,(ON_3dVector *)&local_b0);
              pOVar7 = ON_Circle::Plane(&this->super_ON_Circle);
              pOVar8 = ON_Plane::Xaxis(pOVar7);
              ON_3dVector::ON_3dVector((ON_3dVector *)&local_b0,&local_1c0);
              dVar13 = ON_DotProduct(pOVar8,(ON_3dVector *)&local_b0);
              local_1d8._0_8_ = dVar13;
              pOVar7 = ON_Circle::Plane(&this->super_ON_Circle);
              pOVar8 = ON_Plane::Yaxis(pOVar7);
              ON_3dVector::ON_3dVector((ON_3dVector *)&local_b0,&local_1c0);
              dVar13 = ON_DotProduct(pOVar8,(ON_3dVector *)&local_b0);
              dVar13 = atan2(dVar13,(double)local_1d8._0_8_);
              uVar10 = -(ulong)((double)CONCAT44(uVar12,uVar11) < dVar13);
              local_1d8._8_4_ = extraout_XMM0_Dc;
              local_1d8._0_8_ = dVar13;
              local_1d8._12_4_ = extraout_XMM0_Dd;
              local_208 = local_208 +
                          ((double)(~uVar10 & (ulong)(dVar13 + 6.283185307179586) |
                                   uVar10 & (ulong)dVar13) - (double)CONCAT44(uVar12,uVar11));
              if (RadianParameter < local_208) break;
              iVar4 = ON_NurbsCurve::KnotMultiplicity(&local_1a8,i_00);
              i_00 = iVar4 + i_00;
              iVar3 = iVar3 + -1;
              uVar11 = local_1d8._0_4_;
              uVar12 = local_1d8._4_4_;
            } while (iVar3 != 0);
          }
          iVar3 = ON_NurbsCurve::KnotCount(&local_1a8);
          if (i_00 + 2 < iVar3) {
            dVar13 = ON_NurbsCurve::Knot(&local_1a8,i_00);
            dVar14 = ON_NurbsCurve::Knot(&local_1a8,i_00 + 2);
            ON_Interval::ON_Interval(&local_148,dVar13,dVar14);
            ON_BezierCurve::ON_BezierCurve(&local_168);
            bVar2 = ON_NurbsCurve::ConvertSpanToBezier(&local_1a8,i_00,&local_168);
            if (bVar2) {
              ON_Xform::ON_Xform(&local_b0);
              ON_Plane::ON_Plane(&local_138);
              pOVar7 = ON_Circle::Plane(&this->super_ON_Circle);
              ON_Xform::ChangeBasis(&local_b0,&local_138,pOVar7);
              ON_Plane::~ON_Plane(&local_138);
              ON_BezierCurve::Transform(&local_168,&local_b0);
              lVar9 = 0;
              do {
                dVar14 = tan(RadianParameter);
                pdVar5 = ON_BezierCurve::CV(&local_168,(int)lVar9);
                dVar13 = *pdVar5;
                pdVar5 = ON_BezierCurve::CV(&local_168,(int)lVar9);
                (&local_138.origin.x)[lVar9] = dVar14 * dVar13 - pdVar5[1];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              dVar13 = (local_138.origin.x - (local_138.origin.y + local_138.origin.y)) +
                       local_138.origin.z;
              if (ABS(dVar13) <= 2.3283064365386963e-10) {
                local_138.origin.z = local_138.origin.x - local_138.origin.z;
                if ((local_138.origin.z != 0.0) || (NAN(local_138.origin.z))) {
                  dVar14 = local_138.origin.x / local_138.origin.z;
                }
                else {
                  dVar14 = 1.0;
                }
              }
              else {
                dVar14 = local_138.origin.y * local_138.origin.y -
                         local_138.origin.z * local_138.origin.x;
                local_1d8._0_8_ = dVar14;
                ON_REMOVE_ASAP_AssertEx
                          ((uint)(0.0 <= dVar14),
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_arccurve.cpp"
                           ,0x42d,"","descrim>=0 is false");
                if ((double)local_1d8._0_8_ < 0.0) {
                  dVar1 = sqrt((double)local_1d8._0_8_);
                }
                else {
                  dVar1 = SQRT((double)local_1d8._0_8_);
                }
                dVar14 = ((local_138.origin.x - local_138.origin.y) + dVar1) / dVar13;
                if ((dVar14 < 0.0) || (1.0 < dVar14)) {
                  dVar13 = ((local_138.origin.x - local_138.origin.y) - dVar1) / dVar13;
                  uVar10 = -(ulong)(ABS(dVar13 + -0.5) < ABS(dVar14 + -0.5));
                  dVar14 = (double)(~uVar10 & (ulong)dVar14 | (ulong)dVar13 & uVar10);
                }
                ON_REMOVE_ASAP_AssertEx
                          (-(uint)(-2.3283064365386963e-10 <= dVar14 && dVar14 <= 1.0000000002328306
                                  ) & 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_arccurve.cpp"
                           ,0x436,"",
                           "tbez>=-ON_ZERO_TOLERANCE && tbez<=1+ON_ZERO_TOLERANCE is false");
              }
              uVar11 = 0;
              uVar12 = 0;
              if (0.0 <= dVar14) {
                uVar11 = SUB84(dVar14,0);
                uVar12 = (undefined4)((ulong)dVar14 >> 0x20);
                if (1.0 < dVar14) {
                  uVar11 = 0;
                  uVar12 = 0x3ff00000;
                }
              }
              dVar13 = ON_Interval::ParameterAt(&local_148,(double)CONCAT44(uVar12,uVar11));
              *NurbParameter = dVar13;
            }
            ON_BezierCurve::~ON_BezierCurve(&local_168);
          }
          else {
            pdVar5 = ON_Interval::operator[](&local_1e8,1);
            *NurbParameter = *pdVar5;
            bVar2 = true;
          }
        }
        else {
          bVar2 = false;
        }
        ON_NurbsCurve::~ON_NurbsCurve(&local_1a8);
        return bVar2;
      }
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
    }
    pdVar5 = ON_Interval::operator[](&local_1e8,iVar3);
    *NurbParameter = *pdVar5;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ON_Arc::GetNurbFormParameterFromRadian(double RadianParameter, double* NurbParameter ) const
{
	if(!IsValid() || NurbParameter==nullptr) 
		return false;

  ON_Interval ADomain = DomainRadians();

  double endtol = 10.0*ON_EPSILON*(fabs(ADomain[0]) + fabs(ADomain[1]));

  double del = RadianParameter - ADomain[0];
	if(del <= endtol && del >= -ON_SQRT_EPSILON)
  {
		*NurbParameter=ADomain[0];
		return true;
	} 
  else {
    del = ADomain[1] - RadianParameter;
    if(del <= endtol && del >= -ON_SQRT_EPSILON){
		  *NurbParameter=ADomain[1];
		  return true;
    }
	}

	if( !ADomain.Includes(RadianParameter ) )
		return false;


	ON_NurbsCurve crv;

	if( !GetNurbForm(crv))
		return false;

	//Isolate a bezier that contains the solution
	int cnt = crv.SpanCount();	
	int si =0;	//get span index
	int ki=0;		//knot index
	double ang = ADomain[0];
	ON_3dPoint cp;
	cp = crv.PointAt( crv.Knot(0) ) - Center();
	double x = ON_DotProduct(Plane().Xaxis(),cp);
	double y = ON_DotProduct(Plane().Yaxis(),cp);
	double at = atan2( y, x);	//todo make sure we dont go to far

	for( si=0, ki=0; si<cnt; si++, ki+=crv.KnotMultiplicity(ki) ){
		cp = crv.PointAt( crv.Knot(ki+2)) - Center();
		x = ON_DotProduct(Plane().Xaxis(),cp);
		y = ON_DotProduct(Plane().Yaxis(),cp);
		double at2 = atan2(y,x);
		if(at2>at)
			ang+=(at2-at);
		else
			ang += (2*ON_PI + at2 - at);
		at = at2;
		if( ang>RadianParameter)
			break;
	} 

	// Crash Protection trr#55679
	if( ki+2>= crv.KnotCount())
	{
		 *NurbParameter=ADomain[1];
		 return true;		
	}
	ON_Interval BezDomain(crv.Knot(ki), crv.Knot(ki+2));

	ON_BezierCurve bez;
	if(!crv.ConvertSpanToBezier(ki,bez))
		return false;

 	ON_Xform COC;
	COC.ChangeBasis( ON_Plane(),Plane());   

	
	bez.Transform(COC);	// change coordinates to circles local frame
	double a[3];							// Bez coefficients of a quadratic to solve
	for(int i=0; i<3; i++)
		a[i] = tan(RadianParameter)* bez.CV(i)[0] - bez.CV(i)[1];

	//Solve the Quadratic
	double descrim = (a[1]*a[1]) - a[0]*a[2];
	double squared = a[0]-2*a[1]+a[2];
	double tbez;
	if(fabs(squared)> ON_ZERO_TOLERANCE){
		ON_ASSERT(descrim>=0);
		descrim = sqrt(descrim);
		tbez = (a[0]-a[1] + descrim)/(a[0]-2*a[1]+a[2]);
		if( tbez<0 || tbez>1){
			double tbez2 = (a[0]-a[1]-descrim)/(a[0] - 2*a[1] + a[2]);
			if( fabs(tbez2 - .5)<fabs(tbez-.5) )
				tbez = tbez2;
		}

		ON_ASSERT(tbez>=-ON_ZERO_TOLERANCE && tbez<=1+ON_ZERO_TOLERANCE);
	}
	else{
		// Quadratic degenerates to linear
		tbez = 1.0;
		if(a[0]-a[2])
			tbez = a[0]/(a[0]-a[2]);
	}	
	if(tbez<0)
		tbez=0.0;
	else if(tbez>1.0)
		tbez=1.0;


		//Debug ONLY Code  - check the result
//		double aa = a[0]*(1-tbez)*(1-tbez)  + 2*a[1]*tbez*(1-tbez) + a[2]*tbez*tbez;
//		double tantheta= tan(RadianParameter);
//		ON_3dPoint bezp;
//		bez.Evaluate(tbez, 0, 3, bezp);
//		double yx = bezp.y/bezp.x;


	*NurbParameter = BezDomain.ParameterAt(tbez);
	return true;

}